

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  bool bVar1;
  reference pcVar2;
  char *s;
  undefined1 local_148 [8];
  RegularExpression regex;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  int ch;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  const_iterator i;
  allocator local_49;
  string local_48 [8];
  string regex_str;
  size_type pos;
  string *want_local;
  string *have_local;
  
  regex_str.field_2._8_8_ = std::__cxx11::string::find((string *)have,(ulong)want);
  if (regex_str.field_2._8_8_ == -1) {
    have_local = (string *)0xffffffffffffffff;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"(^|:)(",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_68._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      _Stack_70._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff90);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_68);
      regex.searchstring._4_4_ = (int)*pcVar2;
      if ((((regex.searchstring._4_4_ < 0x61) || (0x7a < regex.searchstring._4_4_)) &&
          ((regex.searchstring._4_4_ < 0x41 || (0x5a < regex.searchstring._4_4_)))) &&
         ((regex.searchstring._4_4_ < 0x30 || (0x39 < regex.searchstring._4_4_)))) {
        std::__cxx11::string::operator+=(local_48,"\\");
      }
      std::__cxx11::string::append((ulong)local_48,'\x01');
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_68);
    }
    std::__cxx11::string::operator+=(local_48,")(:|$)");
    s = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_148,s);
    bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_148,have);
    if (bVar1) {
      have_local = (string *)cmsys::RegularExpression::start((RegularExpression *)local_148,2);
    }
    else {
      have_local = (string *)0xffffffffffffffff;
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_148);
    std::__cxx11::string::~string(local_48);
  }
  return (size_type)have_local;
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  // Search for the desired rpath.
  std::string::size_type pos = have.find(want);

  // If the path is not present we are done.
  if(pos == std::string::npos)
    {
    return pos;
    }

  // Build a regex to match a properly separated path instance.
  std::string regex_str = "(^|:)(";
  for(std::string::const_iterator i = want.begin(); i != want.end(); ++i)
    {
    int ch = *i;
    if(!(('a' <= ch && ch <= 'z') ||
         ('A' <= ch && ch <= 'Z') ||
         ('0' <= ch && ch <= '9')))
      {
      // Escape the non-alphanumeric character.
      regex_str += "\\";
      }
    // Store the character.
    regex_str.append(1, static_cast<char>(ch));
    }
  regex_str += ")(:|$)";

  // Look for the separated path.
  cmsys::RegularExpression regex(regex_str.c_str());
  if(regex.find(have))
    {
    // Return the position of the path portion.
    return regex.start(2);
    }
  else
    {
    // The desired rpath was not found.
    return std::string::npos;
    }
}